

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O2

int Psr_ManReadSignal(Psr_Man_t *p)

{
  undefined1 *puVar1;
  Vec_Int_t *vTemp;
  Vec_Int_t *p_00;
  char cVar2;
  Psr_Ntk_t *pPVar3;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  undefined8 in_RCX;
  undefined8 uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int Value;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  byte *pLim;
  char *pcVar11;
  uint uVar12;
  
  iVar6 = Psr_ManUtilSkipSpaces(p);
  iVar7 = extraout_EDX;
  if (iVar6 != 0) {
    pcVar11 = "Error number 8.";
    goto LAB_002e4ec7;
  }
  pcVar11 = p->pCur;
  cVar2 = *pcVar11;
  uVar10 = CONCAT71((int7)((ulong)in_RCX >> 8),cVar2);
  pcVar4 = pcVar11;
  if ((byte)(cVar2 - 0x3aU) < 0xf6) {
    if (cVar2 != '{') {
      iVar7 = Psr_ManReadName(p);
      if (iVar7 == 0) {
        pcVar11 = "Error number 13.";
        iVar7 = extraout_EDX_00;
      }
      else {
        iVar6 = Psr_ManUtilSkipSpaces(p);
        if (iVar6 == 0) {
          if (*p->pCur != '[') {
            return iVar7 << 2;
          }
          iVar6 = Psr_ManReadRange(p);
          if (iVar6 == 0) {
            pcVar11 = "Error number 15.";
            iVar7 = extraout_EDX_06;
          }
          else {
            iVar8 = Psr_ManUtilSkipSpaces(p);
            if (iVar8 == 0) {
              iVar8 = (p->pNtk->vSlices).nSize;
              Vec_IntPushTwo(&p->pNtk->vSlices,iVar7,iVar6);
              return iVar8 * 4 + 1;
            }
            pcVar11 = "Error number 16.";
            iVar7 = extraout_EDX_07;
          }
        }
        else {
          pcVar11 = "Error number 14.";
          iVar7 = extraout_EDX_01;
        }
      }
      goto LAB_002e4ec7;
    }
    if (p->fUsingTemp2 != 0) {
      pcVar11 = "Cannot read nested concatenations.";
      goto LAB_002e4ec7;
    }
    p->fUsingTemp2 = 1;
    if (*pcVar11 != '{') {
      __assert_fail("Psr_ManIsChar(p, \'{\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                    ,0x192,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
    }
    vTemp = &p->vTemp2;
    p->pCur = pcVar11 + 1;
    iVar7 = Psr_ManReadSignalList(p,vTemp,'}',0);
    if (iVar7 == 0) {
      Psr_ManErrorSet(p,"Error number 7.",Value);
      p->fUsingTemp2 = 0;
      iVar7 = extraout_EDX_08;
LAB_002e5170:
      pcVar11 = "Error number 11.";
    }
    else {
      if (*p->pCur != '}') {
        __assert_fail("Psr_ManIsChar(p, \'}\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                      ,0x196,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
      }
      p->pCur = p->pCur + 1;
      iVar7 = (p->vTemp2).nSize;
      if (iVar7 < 1) {
        __assert_fail("Vec_IntSize(vTemp2) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                      ,0x199,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
      }
      if (iVar7 == 1) {
        iVar6 = Vec_IntEntry(vTemp,0);
        p->fUsingTemp2 = 0;
        iVar7 = extraout_EDX_03;
        if (iVar6 == 0) goto LAB_002e5170;
      }
      else {
        pPVar3 = p->pNtk;
        p_00 = &pPVar3->vConcats;
        uVar12 = (pPVar3->vConcats).nSize;
        if ((uVar12 & 1) == 0) {
          Vec_IntPush(p_00,-1);
          uVar12 = (pPVar3->vConcats).nSize;
        }
        if ((uVar12 & 1) == 0) {
          __assert_fail("Value & 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrs.h"
                        ,0xce,"int Psr_NtkAddConcat(Psr_Ntk_t *, Vec_Int_t *)");
        }
        Vec_IntPush(p_00,(p->vTemp2).nSize);
        Vec_IntAppend(p_00,vTemp);
        iVar6 = uVar12 * 4 + 3;
        p->fUsingTemp2 = 0;
      }
      iVar7 = Psr_ManUtilSkipSpaces(p);
      if (iVar7 == 0) {
        return iVar6;
      }
      pcVar11 = "Error number 12.";
      iVar7 = extraout_EDX_09;
    }
    goto LAB_002e4ec7;
  }
  while( true ) {
    pcVar9 = pcVar4 + 1;
    iVar7 = (int)uVar10 + -0x3a;
    if ((byte)iVar7 < 0xf6) break;
    p->pCur = pcVar9;
    uVar10 = CONCAT71((int7)((ulong)uVar10 >> 8),*pcVar9);
    pcVar4 = pcVar9;
  }
  if ((char)uVar10 == '\'') {
    p->pCur = pcVar9;
    cVar2 = *pcVar9;
    if (cVar2 == 'h') {
      p->pCur = pcVar4 + 2;
      puVar1 = &p->pNtk->field_0x4;
      *puVar1 = *puVar1 | 4;
      pLim = (byte *)p->pCur;
      while ((bVar5 = *pLim, 0xf5 < (byte)(bVar5 - 0x3a) || (0xf9 < (byte)((bVar5 & 0xdf) + 0xb9))))
      {
        if (bVar5 != 0x30) {
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 8;
          pLim = (byte *)p->pCur;
        }
        pLim = pLim + 1;
        p->pCur = (char *)pLim;
      }
    }
    else {
      if (cVar2 != 'd') {
        if (cVar2 == 'b') {
          do {
            pLim = (byte *)(pcVar9 + 1);
            p->pCur = (char *)pLim;
            cVar2 = pcVar9[1];
            if (cVar2 == '0') {
              bVar5 = 4;
            }
            else if (cVar2 == 'z') {
              bVar5 = 0x20;
            }
            else if (cVar2 == 'x') {
              bVar5 = 0x10;
            }
            else {
              if (cVar2 != '1') goto LAB_002e50db;
              bVar5 = 8;
            }
            puVar1 = &p->pNtk->field_0x4;
            *puVar1 = *puVar1 | bVar5;
            pcVar9 = p->pCur;
          } while( true );
        }
        pcVar11 = "Cannot read radix of constant.";
        goto LAB_002e4fc4;
      }
      p->pCur = pcVar4 + 2;
      puVar1 = &p->pNtk->field_0x4;
      *puVar1 = *puVar1 | 4;
      pLim = (byte *)p->pCur;
      while (0xf5 < (byte)(*pLim - 0x3a)) {
        if (*pLim != 0x30) {
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 8;
          pLim = (byte *)p->pCur;
        }
        pLim = pLim + 1;
        p->pCur = (char *)pLim;
      }
    }
LAB_002e50db:
    iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,pcVar11,(char *)pLim,(int *)0x0);
    iVar7 = extraout_EDX_04;
    if (iVar6 != 0) {
      iVar7 = Psr_ManUtilSkipSpaces(p);
      if (iVar7 == 0) {
        return iVar6 * 4 + 2;
      }
      pcVar11 = "Error number 10.";
      iVar7 = extraout_EDX_05;
      goto LAB_002e4ec7;
    }
  }
  else {
    pcVar11 = "Cannot read constant.";
LAB_002e4fc4:
    Psr_ManErrorSet(p,pcVar11,iVar7);
    iVar7 = extraout_EDX_02;
  }
  pcVar11 = "Error number 9.";
LAB_002e4ec7:
  Psr_ManErrorSet(p,pcVar11,iVar7);
  return 0;
}

Assistant:

static inline int Psr_ManReadSignal( Psr_Man_t * p )
{
    int Item;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 8.", 0);
    if ( Psr_ManIsDigit(p) )
    {
        Item = Psr_ManReadConstant(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 9.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 10.", 0);
        return Abc_Var2Lit2( Item, BAC_PRS_CONST );
    }
    if ( Psr_ManIsChar(p, '{') )
    {
        if ( p->fUsingTemp2 )               return Psr_ManErrorSet(p, "Cannot read nested concatenations.", 0);
        p->fUsingTemp2 = 1;
        Item = Psr_ManReadConcat(p, &p->vTemp2);
        p->fUsingTemp2 = 0;
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 11.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 12.", 0);
        return Item;
    }
    else
    {
        Item = Psr_ManReadName( p );
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 13.", 0);    // was        return 1;                
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 14.", 0);
        if ( Psr_ManIsChar(p, '[') )
        {
            int Range = Psr_ManReadRange(p);
            if ( Range == 0 )               return Psr_ManErrorSet(p, "Error number 15.", 0);
            if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 16.", 0);
            return Abc_Var2Lit2( Psr_NtkAddSlice(p->pNtk, Item, Range), BAC_PRS_SLICE );
        }
        return Abc_Var2Lit2( Item, BAC_PRS_NAME );
    }
}